

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O0

void __thiscall QAbstractSlider::setRange(QAbstractSlider *this,int min,int max)

{
  int iVar1;
  QAbstractSliderPrivate *pQVar2;
  int *piVar3;
  int in_ESI;
  QAbstractSlider *in_RDI;
  long in_FS_OFFSET;
  int oldMax;
  int oldMin;
  QAbstractSliderPrivate *d;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int iVar4;
  QAbstractSlider *this_00;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_c = in_ESI;
  pQVar2 = d_func((QAbstractSlider *)0x50cb02);
  iVar4 = *(int *)&(pQVar2->super_QWidgetPrivate).field_0x254;
  iVar1 = pQVar2->maximum;
  *(int *)&(pQVar2->super_QWidgetPrivate).field_0x254 = local_c;
  piVar3 = qMax<int>(&local_c,&local_10);
  pQVar2->maximum = *piVar3;
  if ((iVar4 != *(int *)&(pQVar2->super_QWidgetPrivate).field_0x254) || (iVar1 != pQVar2->maximum))
  {
    (**(code **)(*(long *)&in_RDI->super_QWidget + 0x1a0))(in_RDI,0);
    iVar4 = (int)((ulong)pQVar2 >> 0x20);
    rangeChanged((QAbstractSlider *)0x50cba2,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    setValue(this_00,iVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSlider::setRange(int min, int max)
{
    Q_D(QAbstractSlider);
    int oldMin = d->minimum;
    int oldMax = d->maximum;
    d->minimum = min;
    d->maximum = qMax(min, max);
    if (oldMin != d->minimum || oldMax != d->maximum) {
        sliderChange(SliderRangeChange);
        emit rangeChanged(d->minimum, d->maximum);
        setValue(d->value); // re-bound
    }
}